

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall
QString::arg_impl(QString *this,double a,int fieldWidth,char format,int precision,QChar fillChar)

{
  long lVar1;
  QStringView s;
  QStringView s_00;
  char in_CL;
  QString *in_RDI;
  long in_FS_OFFSET;
  DoubleForm form;
  uint flags;
  NumberOptions numberOptions;
  QLocale locale;
  QString localeArg;
  QString arg;
  ArgEscapeData d;
  QChar *in_stack_fffffffffffffe48;
  QChar *in_stack_fffffffffffffe50;
  QString *in_stack_fffffffffffffe58;
  QStringView *in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffeb0 [12];
  undefined4 in_stack_fffffffffffffebc;
  ArgEscapeData *in_stack_ffffffffffffff30;
  qsizetype in_stack_ffffffffffffff70;
  QChar in_stack_ffffffffffffff7e;
  undefined1 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QStringView in_stack_ffffffffffffffa0;
  QStringView in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QStringView::QStringView<QString,_true>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  s.m_data._4_4_ = in_stack_fffffffffffffebc;
  s._0_12_ = in_stack_fffffffffffffeb0;
  findArgEscapes(s);
  QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffff9e,L'0');
  ::operator==(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  QtMiscUtils::isAsciiUpper((int)in_CL);
  QtMiscUtils::toAsciiLower('\0');
  puVar2 = &DAT_aaaaaaaaaaaaaaaa;
  uVar3 = 0xaaaaaaaa;
  uVar4 = 0xaaaaaaaa;
  QString((QString *)0x51cb80);
  QString((QString *)0x51cc43);
  QStringView::QStringView<QString,_true>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  QStringView::QStringView<QString,_true>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  QStringView::QStringView<QString,_true>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  s_00.m_data._0_4_ = uVar3;
  s_00.m_size = (qsizetype)puVar2;
  s_00.m_data._4_4_ = uVar4;
  replaceArgEscapes(s_00,in_stack_ffffffffffffff30,in_stack_ffffffffffffff70,
                    in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb0,in_stack_ffffffffffffff7e);
  ~QString((QString *)0x51ceae);
  ~QString((QString *)0x51cebb);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QString::arg_impl(double a, int fieldWidth, char format, int precision, QChar fillChar) const
{
    ArgEscapeData d = findArgEscapes(*this);

    if (d.occurrences == 0) {
        qWarning("QString::arg: Argument missing: \"%ls\", %g", qUtf16Printable(*this), a);
        return *this;
    }

    unsigned flags = QLocaleData::NoFlags;
    // ZeroPadded sorts out left-padding when the fill is zero, to the right of sign:
    if (fillChar == u'0')
        flags |= QLocaleData::ZeroPadded;

    if (isAsciiUpper(format))
        flags |= QLocaleData::CapitalEorX;

    QLocaleData::DoubleForm form = QLocaleData::DFDecimal;
    switch (QtMiscUtils::toAsciiLower(format)) {
    case 'f':
        form = QLocaleData::DFDecimal;
        break;
    case 'e':
        form = QLocaleData::DFExponent;
        break;
    case 'g':
        form = QLocaleData::DFSignificantDigits;
        break;
    default:
#if defined(QT_CHECK_RANGE)
        qWarning("QString::arg: Invalid format char '%c'", format);
#endif
        break;
    }

    QString arg;
    if (d.occurrences > d.locale_occurrences) {
        arg = QLocaleData::c()->doubleToString(a, precision, form, fieldWidth,
                                               flags | QLocaleData::ZeroPadExponent);
        Q_ASSERT(fillChar != u'0' || !qt_is_finite(a)
                 || fieldWidth <= arg.size());
    }

    QString localeArg;
    if (d.locale_occurrences > 0) {
        QLocale locale;

        const QLocale::NumberOptions numberOptions = locale.numberOptions();
        if (!(numberOptions & QLocale::OmitGroupSeparator))
            flags |= QLocaleData::GroupDigits;
        if (!(numberOptions & QLocale::OmitLeadingZeroInExponent))
            flags |= QLocaleData::ZeroPadExponent;
        if (numberOptions & QLocale::IncludeTrailingZeroesAfterDot)
            flags |= QLocaleData::AddTrailingZeroes;
        localeArg = locale.d->m_data->doubleToString(a, precision, form, fieldWidth, flags);
        Q_ASSERT(fillChar != u'0' || !qt_is_finite(a)
                 || fieldWidth <= localeArg.size());
    }

    return replaceArgEscapes(*this, d, fieldWidth, arg, localeArg, fillChar);
}